

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::compileBootstrapValue
          (NodeTranslator *this,Reader source,Reader type,Builder target,Schema typeScope)

{
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> **ppRVar1;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar2;
  long lVar3;
  size_t newSize;
  SegmentReader **ppSVar4;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar5;
  byte bVar6;
  SegmentReader *local_78;
  CapTableReader *pCStack_70;
  void *local_68;
  WirePointer *pWStack_60;
  StructDataBitCount local_58;
  StructPointerCount SStack_54;
  undefined2 uStack_52;
  int iStack_50;
  undefined4 uStack_4c;
  SegmentReader *local_48;
  CapTableReader *pCStack_40;
  void *local_38;
  WirePointer *pWStack_30;
  undefined8 local_28;
  int iStack_20;
  undefined4 uStack_1c;
  
  bVar6 = 0;
  compileDefaultDefaultValue(this,type,target);
  if (0xf < type._reader.dataSize) {
    if ((*type._reader.data < 0x13) && ((0x74000U >> (*type._reader.data & 0x1f) & 1) != 0)) {
      local_58 = source._reader.dataSize;
      SStack_54 = source._reader.pointerCount;
      uStack_52 = source._reader._38_2_;
      iStack_50 = source._reader.nestingLimit;
      uStack_4c = source._reader._44_4_;
      local_68 = source._reader.data;
      pWStack_60 = source._reader.pointers;
      local_78 = source._reader.segment;
      pCStack_70 = source._reader.capTable;
      local_28 = type._reader._32_8_;
      iStack_20 = type._reader.nestingLimit;
      uStack_1c = type._reader._44_4_;
      local_38 = type._reader.data;
      pWStack_30 = type._reader.pointers;
      local_48 = type._reader.segment;
      pCStack_40 = type._reader.capTable;
      pRVar2 = (this->unfinishedValues).builder.pos;
      if (pRVar2 == (this->unfinishedValues).builder.endPtr) {
        pRVar5 = (this->unfinishedValues).builder.ptr;
        newSize = 4;
        if (pRVar2 != pRVar5) {
          newSize = ((long)pRVar2 - (long)pRVar5 >> 4) * 0x1c71c71c71c71c72;
        }
        kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
                  (&this->unfinishedValues,newSize);
        pRVar2 = (this->unfinishedValues).builder.pos;
      }
      ppSVar4 = &local_78;
      pRVar5 = pRVar2;
      for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
        (pRVar5->source)._reader.segment = *ppSVar4;
        ppSVar4 = ppSVar4 + (ulong)bVar6 * -2 + 1;
        pRVar5 = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)
                 ((long)pRVar5 + (ulong)bVar6 * -0x10 + 8);
      }
      (pRVar2->typeScope).raw = typeScope.raw;
      (pRVar2->target)._builder.segment = target._builder.segment;
      (pRVar2->target)._builder.capTable = target._builder.capTable;
      (pRVar2->target)._builder.data = target._builder.data;
      (pRVar2->target)._builder.pointers = target._builder.pointers;
      (pRVar2->target)._builder.dataSize = target._builder.dataSize;
      (pRVar2->target)._builder.pointerCount = target._builder.pointerCount;
      *(undefined2 *)&(pRVar2->target)._builder.field_0x26 = target._builder._38_2_;
      ppRVar1 = &(this->unfinishedValues).builder.pos;
      *ppRVar1 = *ppRVar1 + 1;
      return;
    }
  }
  compileValue(this,source,type,typeScope,target,true);
  return;
}

Assistant:

void NodeTranslator::compileBootstrapValue(
    Expression::Reader source, schema::Type::Reader type, schema::Value::Builder target,
    Schema typeScope) {
  // Start by filling in a default default value so that if for whatever reason we don't end up
  // initializing the value, this won't cause schema validation to fail.
  compileDefaultDefaultValue(type, target);

  switch (type.which()) {
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
    case schema::Type::ANY_POINTER:
      unfinishedValues.add(UnfinishedValue { source, type, typeScope, target });
      break;

    default:
      // Primitive value.
      compileValue(source, type, typeScope, target, true);
      break;
  }
}